

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::MultiReporter::addListener(MultiReporter *this,IEventListenerPtr *listener)

{
  unique_ptr<Catch::IEventListener> *in_RSI;
  const_iterator in_RDI;
  IEventListener *in_stack_ffffffffffffffb8;
  MultiReporter *in_stack_ffffffffffffffc0;
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  *this_00;
  
  Detail::unique_ptr<Catch::IEventListener>::operator*(in_RSI);
  updatePreferences(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
             *)((__normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
                 *)in_RDI._M_current + 3);
  std::
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  ::begin((vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           *)in_stack_ffffffffffffffb8);
  __gnu_cxx::
  __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
  ::operator+((__normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
               *)in_RDI._M_current,(difference_type)this_00);
  __gnu_cxx::
  __normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>const*,std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>>>>
  ::__normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>*>
            ((__normal_iterator<const_Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
              *)this_00,
             (__normal_iterator<Catch::Detail::unique_ptr<Catch::IEventListener>_*,_std::vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>_>
              *)in_stack_ffffffffffffffb8);
  std::
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  ::insert(this_00,in_RDI,(value_type *)in_stack_ffffffffffffffb8);
  in_RDI._M_current[7].m_ptr =
       (IEventListener *)((long)&(in_RDI._M_current[7].m_ptr)->_vptr_IEventListener + 1);
  return;
}

Assistant:

void MultiReporter::addListener( IEventListenerPtr&& listener ) {
        updatePreferences(*listener);
        m_reporterLikes.insert(m_reporterLikes.begin() + m_insertedListeners, CATCH_MOVE(listener) );
        ++m_insertedListeners;
    }